

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O0

void __thiscall FloatingDisplay::layoutWidgets(FloatingDisplay *this,int targetWidth)

{
  MidiMessageLEDWidget *pMVar1;
  QWidget *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int h;
  int targetHeight;
  int lcdHeight;
  int lcdWidth;
  int frameWithMargin;
  qreal scale;
  int local_18;
  int local_14;
  FloatingDisplay *pFStack_10;
  int targetWidth_local;
  FloatingDisplay *this_local;
  
  local_18 = this->baseWindowWidth / 2;
  local_14 = targetWidth;
  pFStack_10 = this;
  piVar6 = qMax<int>(&local_14,&local_18);
  scale._4_4_ = this->baseWindowWidth << 3;
  piVar6 = qMin<int>(piVar6,(int *)((long)&scale + 4));
  local_14 = *piVar6;
  pMVar1 = this->midiMessageLED;
  ::operator*(&MIDI_MESSAGE_LED_SIZE,(double)local_14 / (double)this->baseWindowWidth);
  QWidget::resize((QSize *)pMVar1);
  iVar3 = QFrame::frameWidth();
  iVar7 = local_14;
  iVar3 = iVar3 + 2;
  iVar4 = QWidget::width((QWidget *)this->midiMessageLED);
  iVar7 = iVar7 - (iVar4 + iVar3 * 2 + 4);
  iVar4 = (**(code **)(*(long *)this->lcdWidget + 0x80))(this->lcdWidget,iVar7);
  QWidget::resize(&this->lcdWidget->super_QWidget,iVar7,iVar4);
  h = iVar4 + iVar3 * 2;
  pQVar2 = (QWidget *)this->midiMessageLED;
  iVar5 = QWidget::height((QWidget *)this->midiMessageLED);
  QWidget::move(pQVar2,iVar3 + iVar7 + 4,iVar3 + (iVar4 - iVar5) / 2);
  iVar7 = local_14;
  pQVar2 = this->sizeGrip;
  iVar3 = QSize::width(&SIZE_GRIP_SIZE);
  iVar4 = QSize::height(&SIZE_GRIP_SIZE);
  QWidget::move(pQVar2,iVar7 - iVar3,h - iVar4);
  QWidget::resize((QWidget *)this,local_14,h);
  return;
}

Assistant:

void FloatingDisplay::layoutWidgets(int targetWidth) {
	targetWidth = qMin(qMax(targetWidth, baseWindowWidth / 2), 8 * baseWindowWidth);

	qreal scale = targetWidth / qreal(baseWindowWidth);
	midiMessageLED->resize(MIDI_MESSAGE_LED_SIZE * scale);

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;
	int lcdWidth = targetWidth - (midiMessageLED->width() + 2 * frameWithMargin + LAYOUT_SPACING);
	int lcdHeight = lcdWidget->heightForWidth(lcdWidth);
	lcdWidget->resize(lcdWidth, lcdHeight);
	int targetHeight = lcdHeight + 2 * frameWithMargin;

	midiMessageLED->move(frameWithMargin + lcdWidth + LAYOUT_SPACING, frameWithMargin + (lcdHeight - midiMessageLED->height()) / 2);

	sizeGrip->move(targetWidth - SIZE_GRIP_SIZE.width(), targetHeight - SIZE_GRIP_SIZE.height());

	resize(targetWidth, targetHeight);
}